

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O1

Statement * __thiscall SQASTReader::readStatement(SQASTReader *this)

{
  Node *pNVar1;
  
  pNVar1 = readNullable(this);
  if ((pNVar1 != (Node *)0x0) && (pNVar1->_op - TO_VAR < 10 || (int)pNVar1->_op < 0x10)) {
    return (Statement *)pNVar1;
  }
  error(this,"Expected non-null statement node");
}

Assistant:

Statement *SQASTReader::readStatement() {
  Node *n = readNullable();

  if (!n || !n->isStatementOrDeclaration()) {
    error("Expected non-null statement node");
  }

  return (Statement *)n;
}